

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_sequence.hpp
# Opt level: O1

bool jessilib::apply_cpp_escape_sequences<char8_t>
               (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
                *inout_string)

{
  pointer pcVar1;
  char cVar2;
  bool bVar3;
  undefined1 *puVar4;
  char8_t *in_RDX;
  char8_t *extraout_RDX;
  ulong uVar5;
  difference_type __d;
  ulong uVar6;
  ulong uVar7;
  char8_t *pcVar8;
  bool bVar9;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_00;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_01;
  decode_result dVar10;
  jessilib *local_48;
  pointer local_40;
  char8_t *local_38;
  
  local_48 = (jessilib *)inout_string->_M_string_length;
  if (local_48 == (jessilib *)0x0) {
    bVar9 = true;
  }
  else {
    local_40 = (inout_string->_M_dataplus)._M_p;
    in_string._M_str = in_RDX;
    in_string._M_len = (size_t)local_40;
    local_38 = local_40;
    dVar10 = decode_codepoint_utf8<char8_t>(local_48,in_string);
    bVar9 = dVar10.units == 0;
    if (!bVar9) {
      do {
        in_string_00._M_str = (char8_t *)dVar10.units;
        pcVar8 = in_string_00._M_str;
        if (dVar10.codepoint == L'\\') {
          in_string_00._M_len = local_40 + (long)in_string_00._M_str;
          local_48 = local_48 + -(long)in_string_00._M_str;
          local_40 = in_string_00._M_len;
          dVar10 = decode_codepoint_utf8<char8_t>(local_48,in_string_00);
          puVar4 = cpp_escapes_main_tree<char8_t>;
          uVar5 = 0x18;
          do {
            uVar6 = uVar5 >> 1;
            uVar7 = uVar6;
            if ((uint)*(char32_t *)((long)puVar4 + uVar6 * 4 * 4) < (uint)dVar10.codepoint) {
              uVar7 = ~uVar6 + uVar5;
              puVar4 = (undefined1 *)((long)puVar4 + (uVar6 * 4 + 4) * 4);
            }
            uVar5 = uVar7;
          } while (0 < (long)uVar7);
          if ((puVar4 != json_object_tree<char16_t,true>) &&
             (*(char32_t *)puVar4 == dVar10.codepoint)) {
            local_40 = local_40 + dVar10.units;
            local_48 = local_48 + -dVar10.units;
            cVar2 = (**(code **)((long)puVar4 + 8))(&local_38,&local_48);
            bVar3 = false;
            in_string_00._M_str = extraout_RDX;
            if (cVar2 != '\0') goto LAB_00188cd1;
          }
          pcVar1 = (inout_string->_M_dataplus)._M_p;
          in_string_00._M_str = local_38 + -(long)pcVar1;
          if ((char8_t *)inout_string->_M_string_length < in_string_00._M_str) goto LAB_00188d27;
          inout_string->_M_string_length = (size_type)in_string_00._M_str;
          in_string_00._M_str[(long)pcVar1] = '\0';
          bVar3 = true;
        }
        else {
          do {
            *local_38 = *local_40;
            local_38 = local_38 + 1;
            local_40 = local_40 + 1;
            pcVar8 = pcVar8 + -1;
          } while (pcVar8 != (char8_t *)0x0);
          local_48 = local_48 + -(long)in_string_00._M_str;
          bVar3 = false;
        }
LAB_00188cd1:
        if (bVar3) {
          return bVar9;
        }
        in_string_01._M_str = in_string_00._M_str;
        in_string_01._M_len = (size_t)local_40;
        dVar10 = decode_codepoint_utf8<char8_t>(local_48,in_string_01);
        bVar9 = dVar10.units == 0;
      } while (!bVar9);
    }
    pcVar1 = (inout_string->_M_dataplus)._M_p;
    uVar5 = (long)local_38 - (long)pcVar1;
    if (inout_string->_M_string_length < uVar5) {
LAB_00188d27:
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase");
    }
    inout_string->_M_string_length = uVar5;
    pcVar1[uVar5] = '\0';
  }
  return bVar9;
}

Assistant:

constexpr bool apply_cpp_escape_sequences(std::basic_string<CharT>& inout_string) {
	static_assert(is_sorted<CharT, cpp_escapes_root_tree<CharT>, std::size(cpp_escapes_root_tree<CharT>)>(), "Tree must be pre-sorted");
	static_assert(is_sorted<CharT, cpp_escapes_main_tree<CharT>, std::size(cpp_escapes_main_tree<CharT>)>(), "Tree must be pre-sorted");

	return apply_shrink_sequence_tree<CharT, cpp_escapes_root_tree<CharT>, std::size(cpp_escapes_root_tree<CharT>)>(inout_string);
}